

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

bool __thiscall
CBlockPolicyEstimator::processBlockTx
          (CBlockPolicyEstimator *this,uint nBlockHeight,RemovedMempoolTransactionInfo *tx)

{
  long lVar1;
  bool bVar2;
  Logger *this_00;
  int blocksToConfirm;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  CFeeRate feeRate;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = _removeTx(this,&(((tx->info).m_tx.
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash).m_wrapped,true);
  if (bVar2) {
    blocksToConfirm = nBlockHeight - (tx->info).txHeight;
    if (0 < blocksToConfirm) {
      CFeeRate::CFeeRate(&feeRate,&(tx->info).m_fee,(uint32_t)(tx->info).m_virtual_transaction_size)
      ;
      TxConfirmStats::Record
                ((this->feeStats)._M_t.
                 super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
                 super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
                 super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,blocksToConfirm,
                 (double)feeRate.nSatoshisPerK);
      TxConfirmStats::Record
                ((this->shortStats)._M_t.
                 super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
                 super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
                 super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,blocksToConfirm,
                 (double)feeRate.nSatoshisPerK);
      TxConfirmStats::Record
                ((this->longStats)._M_t.
                 super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
                 super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
                 super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,blocksToConfirm,
                 (double)feeRate.nSatoshisPerK);
      bVar2 = true;
      goto LAB_0097580a;
    }
    this_00 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,ESTIMATEFEE,Debug);
    if (bVar2) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "processBlockTx";
      logging_function._M_len = 0xe;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x28c,ESTIMATEFEE,Debug,
                 (ConstevalFormatString<0U>)0xf97c2f);
    }
  }
  bVar2 = false;
LAB_0097580a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::processBlockTx(unsigned int nBlockHeight, const RemovedMempoolTransactionInfo& tx)
{
    AssertLockHeld(m_cs_fee_estimator);
    if (!_removeTx(tx.info.m_tx->GetHash(), true)) {
        // This transaction wasn't being tracked for fee estimation
        return false;
    }

    // How many blocks did it take for miners to include this transaction?
    // blocksToConfirm is 1-based, so a transaction included in the earliest
    // possible block has confirmation count of 1
    int blocksToConfirm = nBlockHeight - tx.info.txHeight;
    if (blocksToConfirm <= 0) {
        // This can't happen because we don't process transactions from a block with a height
        // lower than our greatest seen height
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error Transaction had negative blocksToConfirm\n");
        return false;
    }

    // Feerates are stored and reported as BTC-per-kb:
    CFeeRate feeRate(tx.info.m_fee, tx.info.m_virtual_transaction_size);

    feeStats->Record(blocksToConfirm, static_cast<double>(feeRate.GetFeePerK()));
    shortStats->Record(blocksToConfirm, static_cast<double>(feeRate.GetFeePerK()));
    longStats->Record(blocksToConfirm, static_cast<double>(feeRate.GetFeePerK()));
    return true;
}